

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

bool __thiscall
Centaurus::NFA<wchar_t>::epsilon_closure_sub
          (NFA<wchar_t> *this,set<int,_std::less<int>,_std::allocator<int>_> *closure,int index)

{
  bool bVar1;
  pointer piVar2;
  bool long_flag;
  IndexVector et;
  bool local_45;
  int local_44;
  IndexVector local_40;
  
  local_44 = index;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)closure,
             &local_44);
  local_45 = false;
  NFABaseState<wchar_t,_int>::epsilon_transitions
            (&local_40,
             (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_44,&local_45);
  for (piVar2 = local_40.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; bVar1 = local_45,
      piVar2 != local_40.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar2 = piVar2 + 1) {
    bVar1 = epsilon_closure_sub(this,closure,*piVar2);
    local_45 = (bool)(local_45 | bVar1);
  }
  if (local_40.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
      ._M_impl.super__Vector_impl_data._M_start != (int *)0x0) {
    operator_delete(local_40.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start);
  }
  return bVar1;
}

Assistant:

bool epsilon_closure_sub(std::set<int>& closure, int index) const
    {
        //Always include myself
        closure.insert(index);

        bool long_flag = false;
        IndexVector et = m_states[index].epsilon_transitions(long_flag);

        for (int dest : et)
        {
            long_flag |= epsilon_closure_sub(closure, dest);
        }
        return long_flag;
    }